

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

void __thiscall
wasm::ReconstructStringifyWalker::~ReconstructStringifyWalker(ReconstructStringifyWalker *this)

{
  ReconstructStringifyWalker *this_local;
  
  IRBuilder::~IRBuilder(&this->outlinedBuilder);
  IRBuilder::~IRBuilder(&this->existingBuilder);
  std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::~vector
            (&this->sequences);
  StringifyWalker<wasm::ReconstructStringifyWalker>::~StringifyWalker
            (&this->super_StringifyWalker<wasm::ReconstructStringifyWalker>);
  return;
}

Assistant:

ReconstructStringifyWalker(Module* wasm, Function* func)
    : existingBuilder(*wasm), outlinedBuilder(*wasm), func(func) {
    this->setModule(wasm);
    ODBG(std::cerr << "\nexistingBuilder: " << &existingBuilder
                   << " outlinedBuilder: " << &outlinedBuilder << "\n");
  }